

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O2

void __thiscall
leveldb::VersionEdit::SetCompactPointer(VersionEdit *this,int level,InternalKey *key)

{
  long in_FS_OFFSET;
  undefined1 local_40 [40];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._0_4_ = level;
  std::__cxx11::string::string((string *)(local_40 + 8),&key->rep_);
  std::
  vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>::
  emplace_back<std::pair<int,leveldb::InternalKey>>
            ((vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
              *)&this->compact_pointers_,(pair<int,_leveldb::InternalKey> *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetCompactPointer(int level, const InternalKey& key) {
    compact_pointers_.push_back(std::make_pair(level, key));
  }